

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O3

void Fx_ManCreateLiterals(Fx_Man_t *p,int nVars)

{
  uint uVar1;
  uint *puVar2;
  int *piVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Vec_Wec_t *pVVar7;
  Vec_Int_t *pVVar8;
  void *pvVar9;
  int iVar10;
  int **ppiVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  Vec_Wec_t *pVVar18;
  int iVar19;
  long lVar20;
  
  p->nVars = 0;
  p->nLits = 0;
  pVVar18 = p->vCubes;
  iVar13 = pVVar18->nSize;
  uVar14 = (ulong)iVar13;
  if ((long)uVar14 < 1) {
    uVar4 = 0;
  }
  else {
    pVVar5 = pVVar18->pArray;
    iVar10 = 0;
    uVar4 = 0;
    uVar12 = 0;
    do {
      uVar1 = pVVar5[uVar12].nSize;
      if ((int)uVar1 < 1) {
        __assert_fail("Vec_IntSize(vCube) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                      ,0x2f3,"void Fx_ManCreateLiterals(Fx_Man_t *, int)");
      }
      puVar2 = (uint *)pVVar5[uVar12].pArray;
      uVar17 = *puVar2;
      if ((int)uVar17 < (int)uVar4) {
        uVar17 = uVar4;
      }
      p->nVars = uVar17;
      iVar10 = iVar10 + uVar1 + -1;
      p->nLits = iVar10;
      uVar4 = uVar17;
      if ((ulong)uVar1 != 1) {
        uVar16 = 1;
        do {
          uVar17 = puVar2[uVar16];
          if ((int)uVar17 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf2,"int Abc_Lit2Var(int)");
          }
          uVar17 = uVar17 >> 1;
          if ((int)uVar4 <= (int)uVar17) {
            uVar4 = uVar17;
          }
          p->nVars = uVar4;
          uVar16 = uVar16 + 1;
        } while (uVar1 != uVar16);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar14);
  }
  if (nVars <= (int)uVar4) {
    __assert_fail("p->nVars < nVars",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                  ,0x2fa,"void Fx_ManCreateLiterals(Fx_Man_t *, int)");
  }
  p->nVars = nVars;
  iVar10 = nVars * 2;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  uVar4 = nVars * 2 - 1;
  iVar19 = 0x10;
  if (0xe < uVar4) {
    iVar19 = iVar10;
  }
  pVVar5->nCap = iVar19;
  if (iVar19 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar19 << 2);
  }
  pVVar5->pArray = piVar6;
  pVVar5->nSize = iVar10;
  memset(piVar6,0,(long)iVar10 << 2);
  p->vCounts = pVVar5;
  if (0 < iVar13) {
    pVVar8 = pVVar18->pArray;
    uVar12 = 0;
    do {
      if (1 < pVVar8[uVar12].nSize) {
        piVar3 = pVVar8[uVar12].pArray;
        lVar15 = 1;
        do {
          iVar19 = piVar3[lVar15];
          if (((long)iVar19 < 0) || (iVar10 <= iVar19)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
          }
          piVar6[iVar19] = piVar6[iVar19] + 1;
          lVar15 = lVar15 + 1;
        } while (lVar15 < pVVar8[uVar12].nSize);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < uVar14);
  }
  pVVar7 = (Vec_Wec_t *)malloc(0x10);
  iVar19 = 8;
  if (6 < uVar4) {
    iVar19 = iVar10;
  }
  pVVar7->nCap = iVar19;
  if (iVar19 == 0) {
    pVVar8 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar8 = (Vec_Int_t *)calloc((long)iVar19,0x10);
  }
  pVVar7->pArray = pVVar8;
  pVVar7->nSize = iVar10;
  p->vLits = pVVar7;
  if (0 < nVars) {
    lVar15 = 8;
    lVar20 = 0;
    do {
      if (p->vLits->nSize <= lVar20) {
LAB_00266f8e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                      ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      iVar13 = pVVar5->pArray[lVar20];
      pVVar8 = p->vLits->pArray;
      if (*(int *)((long)pVVar8 + lVar15 + -8) < iVar13) {
        pvVar9 = *(void **)((long)&pVVar8->nCap + lVar15);
        if (pvVar9 == (void *)0x0) {
          pvVar9 = malloc((long)iVar13 << 2);
        }
        else {
          pvVar9 = realloc(pvVar9,(long)iVar13 << 2);
        }
        *(void **)((long)&pVVar8->nCap + lVar15) = pvVar9;
        if (pvVar9 == (void *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        *(int *)((long)pVVar8 + lVar15 + -8) = iVar13;
        pVVar5 = p->vCounts;
      }
      lVar20 = lVar20 + 1;
      lVar15 = lVar15 + 0x10;
    } while (lVar20 < pVVar5->nSize);
    pVVar18 = p->vCubes;
    iVar13 = pVVar18->nSize;
  }
  if (0 < iVar13) {
    lVar15 = 0;
    do {
      pVVar5 = pVVar18->pArray;
      if (1 < pVVar5[lVar15].nSize) {
        lVar20 = 1;
        do {
          uVar4 = pVVar5[lVar15].pArray[lVar20];
          pVVar18 = p->vLits;
          iVar13 = pVVar18->nSize;
          if (iVar13 <= (int)uVar4) {
            iVar19 = uVar4 + 1;
            iVar10 = iVar13 * 2;
            if (iVar13 * 2 <= iVar19) {
              iVar10 = iVar19;
            }
            iVar13 = pVVar18->nCap;
            if (iVar13 < iVar10) {
              if (pVVar18->pArray == (Vec_Int_t *)0x0) {
                pVVar8 = (Vec_Int_t *)malloc((long)iVar10 << 4);
              }
              else {
                pVVar8 = (Vec_Int_t *)realloc(pVVar18->pArray,(long)iVar10 << 4);
                iVar13 = pVVar18->nCap;
              }
              pVVar18->pArray = pVVar8;
              memset(pVVar8 + iVar13,0,(long)(iVar10 - iVar13) << 4);
              pVVar18->nCap = iVar10;
            }
            pVVar18->nSize = iVar19;
            iVar13 = iVar19;
          }
          if (((int)uVar4 < 0) || (iVar13 <= (int)uVar4)) goto LAB_00266f8e;
          Vec_IntPush(pVVar18->pArray + uVar4,(int)lVar15);
          lVar20 = lVar20 + 1;
        } while (lVar20 < pVVar5[lVar15].nSize);
        pVVar18 = p->vCubes;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < pVVar18->nSize);
  }
  iVar13 = p->nVars;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  iVar10 = 0x10;
  if (0xe < iVar13 - 1U) {
    iVar10 = iVar13;
  }
  pVVar5->nCap = iVar10;
  if (iVar10 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar10 << 2);
  }
  pVVar5->pArray = piVar6;
  pVVar5->nSize = iVar13;
  memset(piVar6,0xff,(long)iVar13 << 2);
  p->vVarCube = pVVar5;
  iVar10 = pVVar18->nSize;
  if (0 < iVar10) {
    ppiVar11 = &pVVar18->pArray->pArray;
    lVar15 = 0;
    do {
      if (*(int *)((long)ppiVar11 + -4) < 1) {
LAB_00266feb:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      lVar20 = (long)**ppiVar11;
      if ((lVar20 < 0) || (iVar13 <= **ppiVar11)) goto LAB_00266feb;
      if (piVar6[lVar20] == -1) {
        piVar6[lVar20] = (int)lVar15;
        iVar10 = pVVar18->nSize;
      }
      lVar15 = lVar15 + 1;
      ppiVar11 = ppiVar11 + 2;
    } while (lVar15 < iVar10);
  }
  return;
}

Assistant:

void Fx_ManCreateLiterals( Fx_Man_t * p, int nVars )
{
    Vec_Int_t * vCube;
    int i, k, Lit, Count;
    // find the number of variables
    p->nVars = p->nLits = 0;
    Vec_WecForEachLevel( p->vCubes, vCube, i )
    {
        assert( Vec_IntSize(vCube) > 0 );
        p->nVars = Abc_MaxInt( p->nVars, Vec_IntEntry(vCube, 0) );
        p->nLits += Vec_IntSize(vCube) - 1;
        Vec_IntForEachEntryStart( vCube, Lit, k, 1 )
            p->nVars = Abc_MaxInt( p->nVars, Abc_Lit2Var(Lit) );
    }
//    p->nVars++;
    assert( p->nVars < nVars );
    p->nVars = nVars;
    // count literals
    p->vCounts = Vec_IntStart( 2*p->nVars );
    Vec_WecForEachLevel( p->vCubes, vCube, i )
        Vec_IntForEachEntryStart( vCube, Lit, k, 1 )
            Vec_IntAddToEntry( p->vCounts, Lit, 1 );
    // start literals
    p->vLits = Vec_WecStart( 2*p->nVars );
    Vec_IntForEachEntry( p->vCounts, Count, Lit )
        Vec_IntGrow( Vec_WecEntry(p->vLits, Lit), Count );
    // fill out literals
    Vec_WecForEachLevel( p->vCubes, vCube, i )
        Vec_IntForEachEntryStart( vCube, Lit, k, 1 )
            Vec_WecPush( p->vLits, Lit, i );
    // create mapping of variable into the first cube
    p->vVarCube = Vec_IntStartFull( p->nVars );
    Vec_WecForEachLevel( p->vCubes, vCube, i )
        if ( Vec_IntEntry(p->vVarCube, Vec_IntEntry(vCube, 0)) == -1 )
            Vec_IntWriteEntry( p->vVarCube, Vec_IntEntry(vCube, 0), i );
}